

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O3

int runner(TestReporter *reporter,char *test_library_name,char *suite_name,char *test_name,
          _Bool verbose,_Bool dont_run)

{
  _Bool _Var1;
  int iVar2;
  undefined4 uVar3;
  int iVar4;
  undefined8 uVar5;
  CgreenVector *pCVar6;
  size_t sVar7;
  long lVar8;
  TestSuite *parent;
  TestItem *pTVar9;
  undefined8 *puVar10;
  CgreenTest *test;
  long lVar11;
  char *pcVar12;
  char cVar13;
  ulong uVar14;
  undefined7 in_register_00000081;
  char *local_70;
  int local_64;
  ContextSuite *local_38;
  
  uVar14 = CONCAT71(in_register_00000081,verbose) & 0xffffffff;
  uVar5 = get_test_reporter();
  pCVar6 = (CgreenVector *)
           mock_(uVar5,"discover_tests_in",
                 "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tools/discoverer.mock"
                 ,0xd,"filename, verbose",test_library_name,uVar14);
  iVar2 = cgreen_vector_size(pCVar6);
  if (iVar2 == 0) {
    __printf_chk(1,"No tests found in \'%s\'.\n",test_library_name);
    return 1;
  }
  cVar13 = (char)uVar14;
  if (cVar13 != '\0') {
    uVar3 = cgreen_vector_size(pCVar6);
    __printf_chk(1,"Discovered %d test(s)\n",uVar3);
  }
  if (((ulong)(byte)*test_library_name < 0x30) &&
     ((0xc00000000001U >> ((ulong)(byte)*test_library_name & 0x3f) & 1) != 0)) {
    local_70 = strdup(test_library_name);
  }
  else {
    sVar7 = strlen(test_library_name);
    local_70 = (char *)malloc(sVar7 + 3);
    local_70[0] = '.';
    local_70[1] = '/';
    local_70[2] = '\0';
    strcat(local_70,test_library_name);
  }
  pCVar6 = sorted_test_items_from(pCVar6);
  if (cVar13 != '\0') {
    __printf_chk(1,"Opening [%s]",test_library_name);
  }
  lVar8 = dlopen(local_70,2);
  if (lVar8 == 0) {
    uVar5 = dlerror();
    panic("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tools/runner.c",
          0x12e,"dlopen failure when trying to run \'%s\' (error: %s)\n",local_70,uVar5);
  }
  iVar2 = 0;
  if (dont_run) goto LAB_0010271b;
  local_38 = (ContextSuite *)0x0;
  parent = (TestSuite *)
           create_named_test_suite_
                     (suite_name,
                      "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tools/runner.c"
                      ,0xc3);
  iVar2 = cgreen_vector_size(pCVar6);
  if (iVar2 < 1) {
    local_64 = 0;
LAB_0010264f:
    if (cVar13 != '\0') {
      iVar2 = cgreen_vector_size(pCVar6);
      if (local_64 == iVar2) {
        iVar2 = cgreen_vector_size(pCVar6);
        pcVar12 = " to run all %d discovered tests ...\n";
      }
      else {
        pcVar12 = " to run %d matching tests ...\n";
        iVar2 = local_64;
      }
      __printf_chk(1,pcVar12,iVar2);
    }
    if (local_64 == 0) {
      iVar2 = 1;
      __fprintf_chk(_stderr,1,"ERROR: No such test: \'%s\' in \'%s\'\n",test_name,suite_name);
    }
    else {
      iVar2 = run_test_suite(parent,reporter);
    }
  }
  else {
    local_64 = 0;
    iVar2 = 0;
    do {
      if (test_name == (char *)0x0) {
LAB_0010252a:
        puVar10 = (undefined8 *)cgreen_vector_get(pCVar6,iVar2);
        uVar5 = *puVar10;
        test = (CgreenTest *)dlsym(lVar8,uVar5);
        lVar11 = dlerror();
        if (lVar11 != 0) {
          panic("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tools/runner.c"
                ,0x98,"Could not find specification_name symbol \'%s\'",uVar5);
        }
        pTVar9 = (TestItem *)cgreen_vector_get(pCVar6,iVar2);
        add_test_to_context(parent,&local_38,pTVar9,test);
        local_64 = local_64 + 1;
      }
      else {
        pTVar9 = (TestItem *)cgreen_vector_get(pCVar6,iVar2);
        _Var1 = test_matches_pattern(test_name,pTVar9);
        if (_Var1) goto LAB_0010252a;
      }
      iVar2 = iVar2 + 1;
      iVar4 = cgreen_vector_size(pCVar6);
    } while (iVar2 < iVar4);
    if (local_64 < 0) {
      iVar2 = 1;
      goto LAB_0010271b;
    }
    if (local_64 != 1 || test_name == (char *)0x0) goto LAB_0010264f;
    _Var1 = matching_test_exists(test_name,pCVar6);
    if (cVar13 != '\0') {
      __printf_chk(1," to only run one test: \'%s\' ...\n",test_name);
    }
    if (!_Var1) {
      iVar2 = 1;
      __fprintf_chk(_stderr,1,"ERROR: No such test: \'%s\' in \'%s\'\n",test_name,suite_name);
      goto LAB_0010271b;
    }
    pcVar12 = test_name_of(test_name);
    iVar2 = run_single_test(parent,pcVar12,reporter);
    free(pcVar12);
  }
  destroy_test_suite(parent);
  destroy_context_suites(local_38);
LAB_0010271b:
  dlclose(lVar8);
  free(local_70);
  destroy_cgreen_vector(pCVar6);
  return iVar2;
}

Assistant:

int runner(TestReporter *reporter, const char *test_library_name,
           const char *suite_name, const char *test_name,
           bool verbose, bool dont_run) {
    int status = 0;
    void *test_library_handle = NULL;

    CgreenVector *tests = discover_tests_in(test_library_name, verbose);

    if (count(tests) == 0) {
        printf("No tests found in '%s'.\n", test_library_name);
        return 1;
    }

    if (verbose)
        printf("Discovered %d test(s)\n", count(tests));

    char *absolute_library_name = absolute(test_library_name);
    tests = sorted_test_items_from(tests);
    if (verbose)
        printf("Opening [%s]", test_library_name);
    test_library_handle = dlopen(absolute_library_name, RTLD_NOW);
    if (test_library_handle == NULL) {
        PANIC("dlopen failure when trying to run '%s' (error: %s)\n",
              absolute_library_name, dlerror());
        status = 2;
    } else {
        if (!dont_run) {
            status = run_tests(reporter, suite_name, test_name, test_library_handle,
                               tests, verbose);
        }
        dlclose(test_library_handle);
    }
    free(absolute_library_name);

    destroy_cgreen_vector(tests);

    return status;
}